

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall wasm::TypeBuilder::createRecGroup(TypeBuilder *this,size_t index,size_t length)

{
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Var1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  HeapType local_48;
  unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  local_40;
  _Head_base<0UL,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_false> local_38;
  __single_object groupInfo;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  uVar3 = (long)*(pointer *)((long)&(_Var1._M_head_impl)->entries + 8) -
          *(long *)&((_Var1._M_head_impl)->entries).
                    super__Vector_base<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
          >> 4;
  if ((index <= uVar3) && (length + index <= uVar3)) {
    if (1 < length) {
      std::make_unique<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>();
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve
                (local_38._M_head_impl,length);
      lVar5 = index << 4;
      for (sVar4 = 0;
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
               .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl,
          length != sVar4; sVar4 = sVar4 + 1) {
        lVar2 = *(long *)&((_Var1._M_head_impl)->entries).
                          super__Vector_base<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
        ;
        if (*(long *)(*(uintptr_t *)(lVar2 + lVar5) + 0x20) != 0) {
          __assert_fail("info->recGroup == nullptr && \"group already assigned\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                        ,0x93b,"void wasm::TypeBuilder::createRecGroup(size_t, size_t)");
        }
        local_48.id = *(uintptr_t *)(lVar2 + lVar5);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::emplace_back<wasm::HeapType>
                  (local_38._M_head_impl,&local_48);
        ((tuple<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
          *)(*(long *)(lVar2 + lVar5) + 0x20))->
        super__Tuple_impl<0UL,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
             = (_Tuple_impl<0UL,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                )local_38._M_head_impl;
        *(size_t *)(*(long *)(lVar2 + lVar5) + 0x28) = sVar4;
        lVar5 = lVar5 + 0x10;
      }
      local_48.id = (uintptr_t)local_38._M_head_impl;
      local_40._M_t.
      super___uniq_ptr_impl<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
      .super__Head_base<0UL,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_*,_false>.
      _M_head_impl = (__uniq_ptr_data<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true,_true>
                      )(__uniq_ptr_data<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true,_true>
                        )local_38._M_head_impl;
      local_38._M_head_impl = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)0x0;
      std::
      _Hashtable<wasm::RecGroup,std::pair<wasm::RecGroup_const,std::unique_ptr<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::default_delete<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>,std::allocator<std::pair<wasm::RecGroup_const,std::unique_ptr<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::default_delete<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroup>,std::hash<wasm::RecGroup>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<std::pair<wasm::RecGroup_const,std::unique_ptr<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::default_delete<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>>
                ((_Hashtable<wasm::RecGroup,std::pair<wasm::RecGroup_const,std::unique_ptr<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::default_delete<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>,std::allocator<std::pair<wasm::RecGroup_const,std::unique_ptr<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::default_delete<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroup>,std::hash<wasm::RecGroup>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&(_Var1._M_head_impl)->recGroups,&local_48);
      std::
      unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
      ::~unique_ptr(&local_40);
      std::
      unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
      ::~unique_ptr((unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                     *)&local_38);
    }
    return;
  }
  __assert_fail("index <= size() && index + length <= size() && \"group out of bounds\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x932,"void wasm::TypeBuilder::createRecGroup(size_t, size_t)");
}

Assistant:

void TypeBuilder::createRecGroup(size_t index, size_t length) {
  assert(index <= size() && index + length <= size() && "group out of bounds");
  // Only materialize nontrivial recursion groups.
  if (length < 2) {
    return;
  }
  auto groupInfo = std::make_unique<RecGroupInfo>();
  groupInfo->reserve(length);
  for (size_t i = 0; i < length; ++i) {
    auto& info = impl->entries[index + i].info;
    assert(info->recGroup == nullptr && "group already assigned");
    groupInfo->push_back(asHeapType(info));
    info->recGroup = groupInfo.get();
    info->recGroupIndex = i;
  }
  impl->recGroups.insert(
    {RecGroup(uintptr_t(groupInfo.get())), std::move(groupInfo)});
}